

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::ConcatenationExpression::evalImpl(ConcatenationExpression *this,EvalContext *context)

{
  SourceRange range;
  bool bVar1;
  bool bVar2;
  bitwidth_t bVar3;
  QueueType *pQVar4;
  size_type sVar5;
  undefined8 in_RDX;
  ConcatenationExpression *in_RSI;
  ConstantValue *in_RDI;
  ConstantValue v_1;
  Expression *operand_1;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__range2;
  SmallVector<slang::SVInt,_4UL> values;
  ConstantValue v;
  Expression *operand;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__range3;
  string result_2;
  vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> result_1;
  SVQueue result;
  anon_class_24_3_51b2baad build;
  Type *elemType;
  Type *in_stack_fffffffffffffcb8;
  undefined4 in_stack_fffffffffffffcc0;
  int in_stack_fffffffffffffcc4;
  SmallVector<slang::SVInt,_4UL> *in_stack_fffffffffffffcc8;
  undefined7 in_stack_fffffffffffffcd0;
  undefined1 in_stack_fffffffffffffcd7;
  undefined7 in_stack_fffffffffffffd08;
  undefined1 in_stack_fffffffffffffd0f;
  Diagnostic *in_stack_fffffffffffffd10;
  undefined7 in_stack_fffffffffffffd18;
  undefined1 in_stack_fffffffffffffd1f;
  undefined8 in_stack_fffffffffffffd20;
  DiagCode code;
  span<const_slang::SVInt,_18446744073709551615UL> in_stack_fffffffffffffde0;
  __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
  local_1d0;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> local_1c8;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *local_1b8;
  SVQueue *in_stack_fffffffffffffe60;
  anon_class_24_3_51b2baad *in_stack_fffffffffffffe68;
  __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
  local_120;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> local_118;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *local_108;
  ConstantRange local_e0;
  SourceLocation local_d8;
  SourceLocation SStack_d0;
  undefined4 local_c4;
  ConstantRange local_c0;
  vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> local_b8;
  int local_a0;
  uint32_t local_40;
  undefined8 local_30;
  Type *local_28;
  Type *local_20;
  undefined8 local_18;
  
  code = SUB84((ulong)in_stack_fffffffffffffd20 >> 0x20,0);
  local_18 = in_RDX;
  not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0xa1a63b);
  bVar1 = Type::isUnpackedArray(in_stack_fffffffffffffcb8);
  if (bVar1) {
    not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0xa1a65d);
    local_28 = Type::getArrayElementType((Type *)in_stack_fffffffffffffcc8);
    local_30 = local_18;
    local_20 = local_28;
    not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0xa1a6a6);
    bVar1 = Type::isQueue((Type *)0xa1a6ae);
    if (bVar1) {
      SVQueue::SVQueue((SVQueue *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
      not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0xa1a6d5)
      ;
      Type::getCanonicalType((Type *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
      pQVar4 = Symbol::as<slang::ast::QueueType>((Symbol *)0xa1a703);
      local_40 = pQVar4->maxBound;
      bVar1 = const::$_0::operator()(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
      if (bVar1) {
        SVQueue::resizeToBound
                  ((SVQueue *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
        slang::ConstantValue::ConstantValue
                  ((ConstantValue *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
                   (SVQueue *)in_stack_fffffffffffffcc8);
      }
      else {
        slang::ConstantValue::ConstantValue
                  ((ConstantValue *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                   in_stack_fffffffffffffcb8);
      }
      local_a0 = 1;
      SVQueue::~SVQueue((SVQueue *)0xa1a7ce);
    }
    else {
      std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::vector
                ((vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)0xa1a7e8);
      bVar1 = const::$_0::operator()
                        (in_stack_fffffffffffffe68,
                         (vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)
                         in_stack_fffffffffffffe60);
      if (bVar1) {
        not_null<const_slang::ast::Type_*>::operator->
                  ((not_null<const_slang::ast::Type_*> *)0xa1a86d);
        bVar2 = Type::hasFixedRange((Type *)CONCAT44(in_stack_fffffffffffffcc4,
                                                     in_stack_fffffffffffffcc0));
        bVar1 = false;
        if (bVar2) {
          not_null<const_slang::ast::Type_*>::operator->
                    ((not_null<const_slang::ast::Type_*> *)0xa1a8b8);
          local_c0 = Type::getFixedRange(in_stack_fffffffffffffcb8);
          bVar3 = ConstantRange::width((ConstantRange *)0xa1a8f6);
          sVar5 = std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::size
                            (&local_b8);
          bVar1 = bVar3 != sVar5;
        }
        if (bVar1) {
          local_c4 = 0xa70007;
          local_d8 = (in_RSI->super_Expression).sourceRange.startLoc;
          SStack_d0 = (in_RSI->super_Expression).sourceRange.endLoc;
          range.endLoc._0_7_ = in_stack_fffffffffffffd18;
          range.startLoc = (SourceLocation)in_stack_fffffffffffffd10;
          range.endLoc._7_1_ = in_stack_fffffffffffffd1f;
          EvalContext::addDiag
                    ((EvalContext *)CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
                     code,range);
          not_null<const_slang::ast::Type_*>::operator*
                    ((not_null<const_slang::ast::Type_*> *)0xa1a9a3);
          ast::operator<<(in_stack_fffffffffffffd10,
                          (Type *)CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08));
          not_null<const_slang::ast::Type_*>::operator->
                    ((not_null<const_slang::ast::Type_*> *)0xa1a9dd);
          local_e0 = Type::getFixedRange(in_stack_fffffffffffffcb8);
          ConstantRange::width((ConstantRange *)0xa1aa1b);
          Diagnostic::operator<<<unsigned_int>
                    ((Diagnostic *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
                     (uint)((ulong)in_stack_fffffffffffffcc8 >> 0x20));
          std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::size(&local_b8);
          Diagnostic::operator<<<unsigned_long>
                    ((Diagnostic *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
                     (unsigned_long)in_stack_fffffffffffffcc8);
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                     in_stack_fffffffffffffcb8);
        }
        else {
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                     (Elements *)in_stack_fffffffffffffcb8);
        }
      }
      else {
        slang::ConstantValue::ConstantValue
                  ((ConstantValue *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                   in_stack_fffffffffffffcb8);
      }
      local_a0 = 1;
      std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::~vector
                ((vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)
                 CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
    }
  }
  else {
    not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0xa1aac0);
    bVar1 = Type::isString((Type *)0xa1aac8);
    if (bVar1) {
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
      local_118 = operands(in_RSI);
      local_108 = &local_118;
      local_120._M_current =
           (Expression **)
           std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::begin
                     ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                      in_stack_fffffffffffffcb8);
      std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::end
                ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                 in_stack_fffffffffffffcc8);
      while( true ) {
        bVar1 = __gnu_cxx::
                operator==<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                          ((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                            *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                           (__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                            *)in_stack_fffffffffffffcb8);
        if (((bVar1 ^ 0xffU) & 1) == 0) break;
        __gnu_cxx::
        __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
        ::operator*(&local_120);
        Expression::eval((Expression *)in_stack_fffffffffffffcc8,
                         (EvalContext *)
                         CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
        bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0xa1abaf);
        if (bVar1) {
          not_null<const_slang::ast::Type_*>::operator->
                    ((not_null<const_slang::ast::Type_*> *)0xa1ac32);
          bVar1 = Type::isVoid((Type *)0xa1ac43);
          if (bVar1) {
            local_a0 = 3;
          }
          else {
            slang::ConstantValue::str_abi_cxx11_((ConstantValue *)0xa1ac6d);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffcc8);
            local_a0 = 0;
          }
        }
        else {
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                     in_stack_fffffffffffffcb8);
          local_a0 = 1;
        }
        slang::ConstantValue::~ConstantValue((ConstantValue *)0xa1aca0);
        if ((local_a0 != 0) && (local_a0 != 3)) goto LAB_00a1acf2;
        __gnu_cxx::
        __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
        ::operator++(&local_120);
      }
      slang::ConstantValue::ConstantValue
                ((ConstantValue *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                 (string *)in_stack_fffffffffffffcb8);
      local_a0 = 1;
LAB_00a1acf2:
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
    }
    else {
      SmallVector<slang::SVInt,_4UL>::SmallVector((SmallVector<slang::SVInt,_4UL> *)0xa1ad23);
      local_1c8 = operands(in_RSI);
      local_1b8 = &local_1c8;
      local_1d0._M_current =
           (Expression **)
           std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::begin
                     ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                      in_stack_fffffffffffffcb8);
      std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::end
                ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                 in_stack_fffffffffffffcc8);
      while( true ) {
        bVar1 = __gnu_cxx::
                operator==<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                          ((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                            *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                           (__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                            *)in_stack_fffffffffffffcb8);
        if (((bVar1 ^ 0xffU) & 1) == 0) break;
        __gnu_cxx::
        __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
        ::operator*(&local_1d0);
        Expression::eval((Expression *)in_stack_fffffffffffffcc8,
                         (EvalContext *)
                         CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
        bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0xa1adf4);
        if (bVar1) {
          not_null<const_slang::ast::Type_*>::operator->
                    ((not_null<const_slang::ast::Type_*> *)0xa1ae77);
          in_stack_fffffffffffffcd7 = Type::isVoid((Type *)0xa1ae88);
          if ((bool)in_stack_fffffffffffffcd7) {
            local_a0 = 5;
          }
          else {
            in_stack_fffffffffffffcc8 =
                 (SmallVector<slang::SVInt,_4UL> *)
                 slang::ConstantValue::integer((ConstantValue *)0xa1aeb2);
            SmallVectorBase<slang::SVInt>::push_back
                      ((SmallVectorBase<slang::SVInt> *)
                       CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                       (SVInt *)in_stack_fffffffffffffcb8);
            local_a0 = 0;
          }
        }
        else {
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                     in_stack_fffffffffffffcb8);
          local_a0 = 1;
        }
        slang::ConstantValue::~ConstantValue((ConstantValue *)0xa1aee5);
        if ((local_a0 != 0) && (local_a0 != 5)) goto LAB_00a1afa0;
        in_stack_fffffffffffffcc4 = local_a0;
        __gnu_cxx::
        __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
        ::operator++(&local_1d0);
      }
      std::span<const_slang::SVInt,_18446744073709551615UL>::
      span<slang::SmallVector<slang::SVInt,_4UL>_&>
                ((span<const_slang::SVInt,_18446744073709551615UL> *)
                 CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
                 in_stack_fffffffffffffcc8);
      SVInt::concat(in_stack_fffffffffffffde0);
      slang::ConstantValue::ConstantValue
                ((ConstantValue *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                 (SVInt *)in_stack_fffffffffffffcb8);
      SVInt::~SVInt((SVInt *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
      local_a0 = 1;
LAB_00a1afa0:
      SmallVector<slang::SVInt,_4UL>::~SmallVector((SmallVector<slang::SVInt,_4UL> *)0xa1afad);
    }
  }
  return in_RDI;
}

Assistant:

ConstantValue ConcatenationExpression::evalImpl(EvalContext& context) const {
    if (type->isUnpackedArray()) {
        auto& elemType = *type->getArrayElementType();
        auto build = [&](auto&& result) {
            for (auto op : operands()) {
                ConstantValue cv = op->eval(context);
                if (!cv)
                    return false;

                // Check if we can take this element as-is or if we need to
                // unwrap it into constituents.
                if (elemType.isEquivalent(*op->type))
                    result.emplace_back(std::move(cv));
                else {
                    SLANG_ASSERT(cv.isContainer());
                    const Type& from = *op->type->getArrayElementType();
                    for (auto& elem : cv) {
                        result.emplace_back(ConversionExpression::convert(
                            context, from, elemType, op->sourceRange, std::move(elem),
                            ConversionKind::Implicit));
                    }
                }
            }
            return true;
        };

        if (type->isQueue()) {
            SVQueue result;
            result.maxBound = type->getCanonicalType().as<QueueType>().maxBound;
            if (!build(result))
                return nullptr;

            result.resizeToBound();
            return result;
        }
        else {
            std::vector<ConstantValue> result;
            if (!build(result))
                return nullptr;

            // If we have a fixed size target, check that they match in size.
            if (type->hasFixedRange() && type->getFixedRange().width() != result.size()) {
                context.addDiag(diag::UnpackedConcatSize, sourceRange)
                    << *type << type->getFixedRange().width() << result.size();
                return nullptr;
            }

            return result;
        }
    }

    if (type->isString()) {
        std::string result;
        for (auto operand : operands()) {
            ConstantValue v = operand->eval(context);
            if (!v)
                return nullptr;

            // Skip zero-width replication operands.
            if (operand->type->isVoid())
                continue;

            result.append(v.str());
        }

        return result;
    }

    SmallVector<SVInt, 4> values;
    for (auto operand : operands()) {
        ConstantValue v = operand->eval(context);
        if (!v)
            return nullptr;

        // Skip zero-width replication operands.
        if (operand->type->isVoid())
            continue;

        values.push_back(v.integer());
    }

    return SVInt::concat(values);
}